

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_hint_table_find_strong_points
               (PSH_Hint_Table table,PSH_Point_conflict point,FT_UInt count,FT_Int threshold,
               PSH_Dir major_dir)

{
  uint uVar1;
  PSH_Hint_conflict *ppPVar2;
  long lVar3;
  PSH_Hint_conflict pPVar4;
  PSH_Dir PVar5;
  long lVar6;
  PSH_Hint_conflict hint_4;
  FT_Pos d_3;
  PSH_Hint_conflict hint_3;
  FT_Pos d_2;
  PSH_Hint_conflict hint_2;
  uint local_78;
  FT_UInt max_flag;
  FT_UInt min_flag;
  FT_UInt nn_2;
  FT_Pos d_1;
  PSH_Hint_conflict hint_1;
  FT_UInt nn_1;
  FT_Pos d;
  PSH_Hint_conflict hint;
  FT_UInt nn;
  FT_Pos org_u;
  PSH_Dir point_dir;
  FT_UInt num_hints;
  PSH_Hint_conflict *sort;
  PSH_Dir major_dir_local;
  FT_Int threshold_local;
  FT_UInt count_local;
  PSH_Point_conflict point_local;
  PSH_Hint_Table table_local;
  
  ppPVar2 = table->sort;
  uVar1 = table->num_hints;
  major_dir_local = count;
  _threshold_local = point;
  do {
    if (major_dir_local == PSH_DIR_NONE) {
      return;
    }
    lVar3 = _threshold_local->org_u;
    if ((_threshold_local->flags2 & 0x10) == 0) {
      PVar5 = (_threshold_local->dir_in | _threshold_local->dir_out) & major_dir;
      if ((PVar5 & (PSH_DIR_RIGHT|PSH_DIR_DOWN)) == PSH_DIR_NONE) {
        if ((PVar5 & (PSH_DIR_LEFT|PSH_DIR_UP)) == PSH_DIR_NONE) {
          if ((_threshold_local->flags2 & 0x40) != 0) {
            if (major_dir == PSH_DIR_HORIZONTAL) {
              local_78 = 0x80;
              hint_2._4_4_ = 0x100;
            }
            else {
              local_78 = 0x100;
              hint_2._4_4_ = 0x80;
            }
            if ((_threshold_local->flags2 & local_78) == 0) {
              if ((_threshold_local->flags2 & hint_2._4_4_) != 0) {
                for (max_flag = 0; max_flag < uVar1; max_flag = max_flag + 1) {
                  pPVar4 = ppPVar2[max_flag];
                  lVar6 = (lVar3 - pPVar4->org_pos) - (long)pPVar4->org_len;
                  if ((lVar6 < threshold) && (-lVar6 < (long)threshold)) {
                    _threshold_local->flags2 = _threshold_local->flags2 | 0x400;
                    _threshold_local->hint = pPVar4;
                    _threshold_local->flags2 = _threshold_local->flags2 | 0x10;
                    break;
                  }
                }
              }
            }
            else {
              for (max_flag = 0; max_flag < uVar1; max_flag = max_flag + 1) {
                pPVar4 = ppPVar2[max_flag];
                lVar6 = lVar3 - pPVar4->org_pos;
                if ((lVar6 < threshold) && (-lVar6 < (long)threshold)) {
                  _threshold_local->flags2 = _threshold_local->flags2 | 0x200;
                  _threshold_local->hint = pPVar4;
                  _threshold_local->flags2 = _threshold_local->flags2 | 0x10;
                  break;
                }
              }
            }
            if (_threshold_local->hint == (PSH_Hint_conflict)0x0) {
              for (max_flag = 0; max_flag < uVar1; max_flag = max_flag + 1) {
                pPVar4 = ppPVar2[max_flag];
                if ((pPVar4->org_pos <= lVar3) && (lVar3 <= pPVar4->org_pos + pPVar4->org_len)) {
                  _threshold_local->hint = pPVar4;
                  break;
                }
              }
            }
          }
        }
        else {
          for (hint_1._4_4_ = 0; hint_1._4_4_ < uVar1; hint_1._4_4_ = hint_1._4_4_ + 1) {
            pPVar4 = ppPVar2[hint_1._4_4_];
            lVar6 = (lVar3 - pPVar4->org_pos) - (long)pPVar4->org_len;
            if ((lVar6 < threshold) && (-lVar6 < (long)threshold)) {
              _threshold_local->flags2 = _threshold_local->flags2 | 0x10;
              _threshold_local->flags2 = _threshold_local->flags2 | 0x400;
              _threshold_local->hint = pPVar4;
              break;
            }
          }
        }
      }
      else {
        for (hint._4_4_ = 0; hint._4_4_ < uVar1; hint._4_4_ = hint._4_4_ + 1) {
          pPVar4 = ppPVar2[hint._4_4_];
          lVar6 = lVar3 - pPVar4->org_pos;
          if ((lVar6 < threshold) && (-lVar6 < (long)threshold)) {
            _threshold_local->flags2 = _threshold_local->flags2 | 0x10;
            _threshold_local->flags2 = _threshold_local->flags2 | 0x200;
            _threshold_local->hint = pPVar4;
            break;
          }
        }
      }
    }
    major_dir_local = major_dir_local - PSH_DIR_UP;
    _threshold_local = _threshold_local + 1;
  } while( true );
}

Assistant:

static void
  psh_hint_table_find_strong_points( PSH_Hint_Table  table,
                                     PSH_Point       point,
                                     FT_UInt         count,
                                     FT_Int          threshold,
                                     PSH_Dir         major_dir )
  {
    PSH_Hint*  sort      = table->sort;
    FT_UInt    num_hints = table->num_hints;


    for ( ; count > 0; count--, point++ )
    {
      PSH_Dir  point_dir;
      FT_Pos   org_u = point->org_u;


      if ( psh_point_is_strong( point ) )
        continue;

      point_dir =
        (PSH_Dir)( ( point->dir_in | point->dir_out ) & major_dir );

      if ( point_dir & ( PSH_DIR_DOWN | PSH_DIR_RIGHT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MIN;
            point->hint    = hint;
            break;
          }
        }
      }
      else if ( point_dir & ( PSH_DIR_UP | PSH_DIR_LEFT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MAX;
            point->hint    = hint;
            break;
          }
        }
      }

#if 1
      else if ( psh_point_is_extremum( point ) )
      {
        /* treat extrema as special cases for stem edge alignment */
        FT_UInt  nn, min_flag, max_flag;


        if ( major_dir == PSH_DIR_HORIZONTAL )
        {
          min_flag = PSH_POINT_POSITIVE;
          max_flag = PSH_POINT_NEGATIVE;
        }
        else
        {
          min_flag = PSH_POINT_NEGATIVE;
          max_flag = PSH_POINT_POSITIVE;
        }

        if ( point->flags2 & min_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MIN;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }
        else if ( point->flags2 & max_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MAX;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }

        if ( !point->hint )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];


            if ( org_u >=          hint->org_pos                  &&
                 org_u <= ADD_INT( hint->org_pos, hint->org_len ) )
            {
              point->hint = hint;
              break;
            }
          }
        }
      }

#endif /* 1 */
    }
  }